

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O0

void __thiscall TasGrid::GridGlobal::proposeUpdatedTensors(GridGlobal *this)

{
  int max_level;
  bool local_151;
  anon_class_8_1_8991fb9c local_150;
  function<int_(int)> local_148;
  MultiIndexSet local_128;
  MultiIndexSet local_100;
  OneDimensionalWrapper local_c8;
  GridGlobal *local_10;
  GridGlobal *this_local;
  
  local_10 = this;
  max_level = MultiIndexSet::getMaxIndex(&this->updated_tensors);
  OneDimensionalWrapper::OneDimensionalWrapper
            (&local_c8,&this->custom,max_level,this->rule,this->alpha,this->beta);
  OneDimensionalWrapper::operator=(&this->wrapper,&local_c8);
  OneDimensionalWrapper::~OneDimensionalWrapper(&local_c8);
  MultiIndexManipulations::computeActiveTensorsWeights
            (&this->updated_tensors,&this->updated_active_tensors,&this->updated_active_w);
  local_151 = OneDimensionalMeta::isNonNested(this->rule);
  if (local_151) {
    MultiIndexManipulations::generateNonNestedPoints
              (&local_128,&this->updated_active_tensors,&this->wrapper);
  }
  else {
    local_150.this = this;
    ::std::function<int(int)>::function<TasGrid::GridGlobal::proposeUpdatedTensors()::__0,void>
              ((function<int(int)> *)&local_148,&local_150);
    MultiIndexManipulations::generateNestedPoints(&local_128,&this->updated_tensors,&local_148);
  }
  local_151 = !local_151;
  MultiIndexSet::operator-(&local_100,&local_128,&(this->super_BaseCanonicalGrid).points);
  MultiIndexSet::operator=(&(this->super_BaseCanonicalGrid).needed,&local_100);
  MultiIndexSet::~MultiIndexSet(&local_100);
  MultiIndexSet::~MultiIndexSet(&local_128);
  if (local_151) {
    ::std::function<int_(int)>::~function((function<int_(int)> *)&local_148);
  }
  return;
}

Assistant:

void GridGlobal::proposeUpdatedTensors(){
    wrapper = OneDimensionalWrapper(custom, updated_tensors.getMaxIndex(), rule, alpha, beta);

    MultiIndexManipulations::computeActiveTensorsWeights(updated_tensors, updated_active_tensors, updated_active_w);

    // the new needed points are the points associated with the updated_active_tensors without the existing set of loaded points
    needed = ((OneDimensionalMeta::isNonNested(rule)) ?
                MultiIndexManipulations::generateNonNestedPoints(updated_active_tensors, wrapper) :
                MultiIndexManipulations::generateNestedPoints(updated_tensors, [&](int l) -> int{ return wrapper.getNumPoints(l); }))
             - points;
}